

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationParams::ActivationParams
          (ActivationParams *this,ActivationParams *from)

{
  NonlinearityTypeCase NVar1;
  InternalMetadataWithArenaLite *this_00;
  ActivationLinear *this_01;
  ActivationLinear *from_00;
  ActivationReLU *this_02;
  ActivationReLU *from_01;
  ActivationLeakyReLU *this_03;
  ActivationLeakyReLU *from_02;
  ActivationThresholdedReLU *this_04;
  ActivationThresholdedReLU *from_03;
  ActivationPReLU *this_05;
  ActivationPReLU *from_04;
  ActivationTanh *this_06;
  ActivationTanh *from_05;
  ActivationScaledTanh *this_07;
  ActivationScaledTanh *from_06;
  ActivationSigmoid *this_08;
  ActivationSigmoid *from_07;
  ActivationSigmoidHard *this_09;
  ActivationSigmoidHard *from_08;
  ActivationELU *this_10;
  ActivationELU *from_09;
  ActivationSoftsign *this_11;
  ActivationSoftsign *from_10;
  ActivationSoftplus *this_12;
  ActivationSoftplus *from_11;
  ActivationParametricSoftplus *this_13;
  ActivationParametricSoftplus *from_12;
  double __x;
  ActivationParams *from_local;
  ActivationParams *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ActivationParams_0056c490;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  NonlinearityTypeUnion::NonlinearityTypeUnion((NonlinearityTypeUnion *)&this->NonlinearityType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  clear_has_NonlinearityType(this);
  NVar1 = NonlinearityType_case(from);
  switch(NVar1) {
  case NONLINEARITYTYPE_NOT_SET:
    break;
  case kLinear:
    this_01 = mutable_linear(this);
    from_00 = linear(from);
    ActivationLinear::MergeFrom(this_01,from_00);
    break;
  case kReLU:
    this_02 = mutable_relu(this);
    from_01 = relu(from);
    ActivationReLU::MergeFrom(this_02,from_01);
    break;
  case kLeakyReLU:
    this_03 = mutable_leakyrelu(this);
    from_02 = leakyrelu(from);
    ActivationLeakyReLU::MergeFrom(this_03,from_02);
    break;
  case kThresholdedReLU:
    this_04 = mutable_thresholdedrelu(this);
    from_03 = thresholdedrelu(from);
    ActivationThresholdedReLU::MergeFrom(this_04,from_03);
    break;
  case kPReLU:
    this_05 = mutable_prelu(this);
    from_04 = prelu(from);
    ActivationPReLU::MergeFrom(this_05,from_04);
    break;
  case kTanh:
    this_06 = mutable_tanh(this);
    tanh(from,__x);
    ActivationTanh::MergeFrom(this_06,from_05);
    break;
  case kScaledTanh:
    this_07 = mutable_scaledtanh(this);
    from_06 = scaledtanh(from);
    ActivationScaledTanh::MergeFrom(this_07,from_06);
    break;
  case kSigmoid:
    this_08 = mutable_sigmoid(this);
    from_07 = sigmoid(from);
    ActivationSigmoid::MergeFrom(this_08,from_07);
    break;
  case kSigmoidHard:
    this_09 = mutable_sigmoidhard(this);
    from_08 = sigmoidhard(from);
    ActivationSigmoidHard::MergeFrom(this_09,from_08);
    break;
  case kELU:
    this_10 = mutable_elu(this);
    from_09 = elu(from);
    ActivationELU::MergeFrom(this_10,from_09);
    break;
  case kSoftsign:
    this_11 = mutable_softsign(this);
    from_10 = softsign(from);
    ActivationSoftsign::MergeFrom(this_11,from_10);
    break;
  case kSoftplus:
    this_12 = mutable_softplus(this);
    from_11 = softplus(from);
    ActivationSoftplus::MergeFrom(this_12,from_11);
    break;
  case kParametricSoftplus:
    this_13 = mutable_parametricsoftplus(this);
    from_12 = parametricsoftplus(from);
    ActivationParametricSoftplus::MergeFrom(this_13,from_12);
  }
  return;
}

Assistant:

ActivationParams::ActivationParams(const ActivationParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_NonlinearityType();
  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ActivationParams)
}